

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O3

void __thiscall BmsBms::Merge(BmsBms *this,BmsBms *other)

{
  BmsRegistArraySet *this_00;
  BmsRegistArraySet *this_01;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr this_02;
  bool bVar3;
  Iterator IVar4;
  Iterator IVar5;
  ConstIterator CVar6;
  ConstIterator CVar7;
  BmsRegistArray *pBVar8;
  BmsRegistArray *this_03;
  string *value;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  ConstIterator CVar11;
  ConstIterator CVar12;
  Iterator IVar13;
  Iterator IVar14;
  BmsWord *channel_number;
  BmsChannel *this_04;
  BmsBuffer *pBVar15;
  Iterator IVar16;
  Iterator IVar17;
  BmsDuplicateHeaderException *pBVar18;
  uint uVar19;
  int iVar20;
  BmsChannelManager *this_05;
  double d;
  BmsWord word;
  string local_50;
  
  IVar4 = BmsHeaderTable::Begin_abi_cxx11_(&other->headers_);
  IVar5 = BmsHeaderTable::End_abi_cxx11_(&other->headers_);
  if (IVar4._M_node != IVar5._M_node) {
    do {
      p_Var10 = IVar4._M_node + 1;
      bVar3 = BmsHeaderTable::IsExists(&this->headers_,(string *)p_Var10);
      if (bVar3) {
        pBVar18 = (BmsDuplicateHeaderException *)__cxa_allocate_exception(0x28);
        BmsDuplicateHeaderException::BmsDuplicateHeaderException(pBVar18,(string *)p_Var10);
        __cxa_throw(pBVar18,&BmsDuplicateHeaderException::typeinfo,
                    BmsDuplicateHeaderException::~BmsDuplicateHeaderException);
      }
      BmsHeader::ToString_abi_cxx11_(&local_50,(BmsHeader *)(IVar4._M_node + 2));
      BmsHeaderTable::Set(&this->headers_,(string *)p_Var10,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      IVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(IVar4._M_node);
      IVar5 = BmsHeaderTable::End_abi_cxx11_(&other->headers_);
    } while (IVar4._M_node != IVar5._M_node);
  }
  this_00 = &other->array_set_;
  this_01 = &this->array_set_;
  iVar20 = 0;
  do {
    BmsWord::BmsWord((BmsWord *)&local_50,iVar20);
    CVar6 = BmsRegistArraySet::Begin_abi_cxx11_(this_00);
    while( true ) {
      CVar7 = BmsRegistArraySet::End_abi_cxx11_(this_00);
      if (CVar6._M_node == CVar7._M_node) break;
      p_Var10 = CVar6._M_node + 1;
      bVar3 = BmsRegistArraySet::Exists(this_01,(string *)p_Var10);
      if (!bVar3) {
        BmsRegistArraySet::MakeNewArray(this_01,(string *)p_Var10);
      }
      pBVar8 = BmsRegistArraySet::operator[](this_00,(string *)p_Var10);
      bVar3 = BmsRegistArray::IsExists(pBVar8,(BmsWord *)&local_50);
      if (bVar3) {
        pBVar8 = BmsRegistArraySet::operator[](this_01,(string *)p_Var10);
        bVar3 = BmsRegistArray::IsExists(pBVar8,(BmsWord *)&local_50);
        if (bVar3) {
          pBVar18 = (BmsDuplicateHeaderException *)__cxa_allocate_exception(0x28);
          BmsDuplicateHeaderException::BmsDuplicateHeaderException(pBVar18,(string *)p_Var10);
          __cxa_throw(pBVar18,&BmsDuplicateHeaderException::typeinfo,
                      BmsDuplicateHeaderException::~BmsDuplicateHeaderException);
        }
        pBVar8 = BmsRegistArraySet::operator[](this_01,(string *)p_Var10);
        this_03 = BmsRegistArraySet::operator[](this_00,(string *)p_Var10);
        value = BmsRegistArray::operator[][abi_cxx11_(this_03,(BmsWord *)&local_50);
        BmsRegistArray::Set(pBVar8,(BmsWord *)&local_50,value);
      }
      CVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(CVar6._M_node);
    }
    BmsWord::~BmsWord((BmsWord *)&local_50);
    iVar20 = iVar20 + 1;
    if (iVar20 == 0x510) {
      p_Var10 = (other->stp_manager_).stp_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(other->stp_manager_).stp_._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var10 != p_Var1) {
        do {
          local_50._M_dataplus._M_p = *(pointer *)(p_Var10 + 1);
          iVar20 = *(int *)&p_Var10[1]._M_parent;
          pmVar9 = std::
                   map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::operator[](&(this->stp_manager_).stp_,(key_type_conflict *)&local_50);
          *pmVar9 = *pmVar9 + iVar20;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var1);
      }
      uVar19 = (other->bar_manager_).barresolution_;
      uVar2 = (this->bar_manager_).barresolution_;
      if (uVar19 != uVar2) {
        d = (double)uVar19 / (double)uVar2;
        BmsBarManager::SetResolution(&this->bar_manager_,d);
        IVar16 = BmsChannelManager::Begin(&this->channel_manager_);
        while( true ) {
          IVar17 = BmsChannelManager::End(&this->channel_manager_);
          if (IVar16._M_node == IVar17._M_node) break;
          BmsChannel::MultiplyBarDivisionCount((BmsChannel *)IVar16._M_node[1]._M_parent,d);
          IVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(IVar16._M_node);
        }
      }
      this_05 = &other->channel_manager_;
      CVar11 = BmsChannelManager::Begin(this_05);
      CVar12 = BmsChannelManager::End(this_05);
      if (CVar11._M_node != CVar12._M_node) {
        do {
          this_02 = CVar11._M_node[1]._M_parent;
          IVar13 = BmsChannel::Begin((BmsChannel *)this_02);
          IVar14 = BmsChannel::End((BmsChannel *)this_02);
          if (IVar13._M_current != IVar14._M_current) {
            uVar19 = 0;
            do {
              channel_number = BmsChannel::GetChannelNumber((BmsChannel *)this_02);
              this_04 = BmsChannelManager::operator[](&this->channel_manager_,channel_number);
              pBVar15 = BmsChannel::operator[](this_04,uVar19);
              (*pBVar15->_vptr_BmsBuffer[2])(pBVar15,*IVar13._M_current);
              uVar19 = uVar19 + 1;
              IVar13._M_current = IVar13._M_current + 1;
              IVar14 = BmsChannel::End((BmsChannel *)this_02);
            } while (IVar13._M_current != IVar14._M_current);
          }
          CVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(CVar11._M_node);
          CVar12 = BmsChannelManager::End(this_05);
        } while (CVar11._M_node != CVar12._M_node);
      }
      return;
    }
  } while( true );
}

Assistant:

void
BmsBms::Merge(const BmsBms& other)
{
	// merge BmsHeaderTable
	// throw exception when duplicated header exists
	for (BmsHeaderTable::Iterator it = other.headers_.Begin(); it != other.headers_.End(); ++it) {
		if (headers_.IsExists(it->first)) {
			throw BmsDuplicateHeaderException(it->first);
		}
		headers_.Set(it->first, it->second.ToString());
	}
	// merge all registed information (#WAV, #BMP, etc channel)
	// if same key exists, then raise exception
	for (unsigned int i = 0; i < BmsConst::WORD_MAX_COUNT; ++i) {
		BmsWord word(i);
		for (BmsRegistArraySet::ConstIterator it = other.array_set_.Begin(); it != other.array_set_.End(); ++it) {
			if (NOT(array_set_.Exists(it->first))) {
				array_set_.MakeNewArray(it->first);
			}
			if (other.array_set_[it->first].IsExists(word)) {
				if (array_set_[it->first].IsExists(word)) {
					throw BmsDuplicateHeaderException(it->first);
				}
				array_set_[it->first].Set(word, other.array_set_[it->first][word]);
			}
		}
	}
	// merge STP
	for (auto it = other.stp_manager_.Begin(); it != other.stp_manager_.End(); ++it) {
		stp_manager_.Add(it->first, it->second);
	}

	// before channel merge, check resolution
	// other one is const, so there's only one way - match my resolution to others ...
	if (other.bar_manager_.GetResolution() != bar_manager_.GetResolution()) {
		double ratio = (double)other.bar_manager_.GetResolution() / bar_manager_.GetResolution();
		bar_manager_.SetResolution(ratio);
		for (auto it = channel_manager_.Begin(); it != channel_manager_.End(); ++it) {
			it->second->MultiplyBarDivisionCount(ratio);
		}
	}

	// merge channel
	for (BmsChannelManager::ConstIterator it = other.channel_manager_.Begin(); it != other.channel_manager_.End(); ++it) {
		unsigned int i = 0;
		BmsChannel& current_channel = *it->second;
		for (BmsChannel::ConstIterator current_buffer = current_channel.Begin(); current_buffer != current_channel.End(); ++current_buffer) {\
			channel_manager_[current_channel.GetChannelNumber()][i].Merge(**current_buffer);
			++i;
		}
	}
}